

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYWriter::addComment(PLYWriter *this,string *s)

{
  pointer *pppPVar1;
  iterator __position;
  PLYElement *this_00;
  IOException *this_01;
  PLYElement *comment;
  undefined1 local_40 [32];
  
  if (this->header_complete != true) {
    this_00 = (PLYElement *)operator_new(0x40);
    PLYElement::PLYElement(this_00,s,-1);
    __position._M_current =
         (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._0_8_ = this_00;
      std::vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>>::
      _M_realloc_insert<gvr::PLYElement*const&>
                ((vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>> *)&this->list,__position
                 ,(PLYElement **)local_40);
    }
    else {
      *__position._M_current = this_00;
      pppPVar1 = &(this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x28);
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Creation of ply header has been completed","");
  gutil::IOException::IOException(this_01,(string *)local_40);
  __cxa_throw(this_01,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PLYWriter::addComment(const std::string &s)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  PLYElement *comment=new PLYElement(s, -1);

  list.push_back(comment);
}